

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RollingBuffer_p.cpp
# Opt level: O3

size_t __thiscall BamTools::Internal::RollingBuffer::Read(RollingBuffer *this,char *dest,size_t max)

{
  ByteArray *this_00;
  char *pcVar1;
  size_t sVar2;
  ulong __n;
  size_t sVar3;
  
  if (this->m_totalBufferSize < max) {
    max = this->m_totalBufferSize;
  }
  if (max == 0) {
    sVar3 = 0;
  }
  else {
    sVar3 = 0;
    do {
      this_00 = (this->m_data).
                super__Deque_base<BamTools::Internal::ByteArray,_std::allocator<BamTools::Internal::ByteArray>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur;
      if ((this->m_data).
          super__Deque_base<BamTools::Internal::ByteArray,_std::allocator<BamTools::Internal::ByteArray>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur == this_00) {
        pcVar1 = (char *)0x0;
      }
      else {
        pcVar1 = ByteArray::ConstData(this_00);
        pcVar1 = pcVar1 + this->m_head;
      }
      if (this->m_tailBufferIndex == 0) {
        sVar2 = this->m_tail;
      }
      else {
        sVar2 = ByteArray::Size((this->m_data).
                                super__Deque_base<BamTools::Internal::ByteArray,_std::allocator<BamTools::Internal::ByteArray>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_cur);
      }
      __n = sVar2 - this->m_head;
      if (max - sVar3 <= __n) {
        __n = max - sVar3;
      }
      if (dest != (char *)0x0) {
        memcpy(dest + sVar3,pcVar1,__n);
      }
      sVar3 = sVar3 + __n;
      Free(this,__n);
    } while (sVar3 < max);
  }
  return sVar3;
}

Assistant:

std::size_t RollingBuffer::Read(char* dest, std::size_t max)
{

    std::size_t bytesToRead = std::min(Size(), max);
    std::size_t bytesReadSoFar = 0;

    while (bytesReadSoFar < bytesToRead) {
        const char* readPtr = ReadPointer();
        std::size_t blockBytes = std::min((bytesToRead - bytesReadSoFar), BlockSize());
        if (dest) {
            std::memcpy(dest + bytesReadSoFar, readPtr, blockBytes);
        }
        bytesReadSoFar += blockBytes;
        Free(blockBytes);
    }

    return bytesReadSoFar;
}